

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O3

void __thiscall
TPZCompElDisc::Shape
          (TPZCompElDisc *this,TPZVec<double> *qsi,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  TPZGeoEl *pTVar1;
  TPZManVector<double,_4> x;
  TPZVec<double> local_68;
  double local_48 [4];
  
  if (this->fUseQsiEta == true) {
    (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x330))
              (this,qsi,phi,dphi);
    return;
  }
  TPZVec<double>::TPZVec(&local_68,0);
  local_68._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b960;
  local_68.fNElements = 3;
  local_68.fNAlloc = 0;
  local_68.fStore = local_48;
  pTVar1 = TPZCompEl::Reference((TPZCompEl *)this);
  (**(code **)(*(long *)pTVar1 + 0x228))(pTVar1,qsi,&local_68);
  (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x330))
            (this,&local_68,phi,dphi);
  if (local_68.fStore != local_48) {
    local_68.fNAlloc = 0;
    local_68._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_68.fStore != (double *)0x0) {
      operator_delete__(local_68.fStore);
    }
  }
  return;
}

Assistant:

void TPZCompElDisc::Shape(TPZVec<REAL> &qsi,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
    if(fUseQsiEta==true){
        this->ShapeX(qsi,phi,dphi);
    }else{

        TPZManVector<REAL,4> x(3);
        this->Reference()->X(qsi,x);
        this->ShapeX(x,phi,dphi);
    }
}